

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O1

MPP_RET hal_h265e_v510_ret_task(void *hal,HalEncTask *task)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  long lVar7;
  EncRcTask *pEVar8;
  EncRcTask *pEVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  RK_U32 RVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  
  lVar7 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  pEVar8 = task->rc_task;
  sVar16 = mpp_packet_get_length(task->packet);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0xa06);
  }
  pEVar9 = task->rc_task;
  lVar17 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  iVar23 = *(int *)(*(long *)((long)hal + 0x390) + 0xc);
  iVar18 = *(int *)(*(long *)((long)hal + 0x390) + 0x10);
  puVar10 = *(uint **)(lVar17 + 0x20);
  uVar15 = *puVar10;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x8c8);
  }
  *(int *)(lVar17 + 0x30) = *(int *)(lVar17 + 0x30) + puVar10[4];
  *(int *)(lVar17 + 0x34) = *(int *)(lVar17 + 0x34) + puVar10[1];
  *(long *)(lVar17 + 0x40) =
       *(long *)(lVar17 + 0x40) + (ulong)(puVar10[3] << 0x10 | puVar10[2] >> 0x10);
  *(uint *)(lVar17 + 0x28) = uVar15;
  if (((byte)hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","hw_status: 0x%08x",(char *)0x0,(ulong)uVar15);
  }
  if ((uVar15 & 2) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_LINKTABLE_FINISH","vepu510_h265_set_feedback");
  }
  if (((uVar15 & 1) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
  }
  if (((uVar15 & 8) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","RKV_ENC_INT_ONE_SLICE_FINISH",(char *)0x0);
  }
  if ((uVar15 & 4) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_SAFE_CLEAR_FINISH","vepu510_h265_set_feedback");
  }
  if ((uVar15 & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BIT_STREAM_OVERFLOW","vepu510_h265_set_feedback");
  }
  if ((uVar15 & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_WRITE_FULL","vepu510_h265_set_feedback");
  }
  if ((uVar15 & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_WRITE_ERROR","vepu510_h265_set_feedback");
  }
  iVar23 = (iVar18 + 7U & 0x1ffffff8) * (iVar23 + 7U & 0xfffffff8);
  if ((char)uVar15 < '\0') {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_READ_ERROR","vepu510_h265_set_feedback");
  }
  uVar24 = iVar23 >> 4;
  if ((uVar15 >> 8 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_TIMEOUT_ERROR","vepu510_h265_set_feedback");
  }
  *(int *)(lVar17 + 0x140) = *(int *)(lVar17 + 0x140) + (puVar10[0x29] & 0x7fffff);
  *(int *)(lVar17 + 0x48) = *(int *)(lVar17 + 0x48) + (puVar10[0x21] & 0x1ffff);
  *(int *)(lVar17 + 0x4c) = *(int *)(lVar17 + 0x4c) + (puVar10[0x22] & 0x7ffff);
  iVar27 = (puVar10[0x25] & 0x7ffff) + *(int *)(lVar17 + 0x58);
  *(int *)(lVar17 + 0x58) = iVar27;
  *(int *)(lVar17 + 0x50) = *(int *)(lVar17 + 0x50) + (puVar10[0x23] & 0x1fffff);
  iVar25 = (puVar10[0x26] & 0x1fffff) + *(int *)(lVar17 + 0x5c);
  *(int *)(lVar17 + 0x5c) = iVar25;
  *(int *)(lVar17 + 0x54) = *(int *)(lVar17 + 0x54) + (puVar10[0x24] & 0x7fffff);
  iVar29 = (puVar10[0x27] & 0x7fffff) + *(int *)(lVar17 + 0x60);
  *(int *)(lVar17 + 0x60) = iVar29;
  iVar18 = (puVar10[0x28] & 0x7fffff) + *(int *)(lVar17 + 100);
  *(int *)(lVar17 + 100) = iVar18;
  *(uint *)((long)hal + 0x200) = puVar10[0x52] >> 0xf;
  *(uint *)((long)hal + 0x204) = puVar10[0x53] >> 0xf;
  *(uint *)((long)hal + 0x208) = puVar10[0x4e];
  uVar15 = iVar23 >> 6;
  *(uint *)((long)hal + 0x1e4) = puVar10[0x29] & 0x7fffff;
  memcpy((void *)(lVar17 + 0x68),puVar10 + 0x61,0xd0);
  if (0 < (int)uVar24) {
    (pEVar9->info).iblk4_prop =
         (uint)((iVar18 + iVar29) * 0x400 + iVar27 * 0x4000 + iVar25 * 0x1000) / uVar24;
  }
  if (0 < (int)uVar15) {
    (pEVar9->info).quality_real = *(uint *)(lVar17 + 0x30) / uVar15;
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0x905);
  }
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar16,*(RK_U32 *)(lVar7 + 0x34),"hal_h265e_v510_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)(lVar7 + 0x34));
  (pEVar8->info).sse = *(RK_S64 *)(lVar7 + 0x40);
  (pEVar8->info).lvl64_inter_num = *(RK_U32 *)(lVar7 + 0x48);
  (pEVar8->info).lvl32_inter_num = *(RK_U32 *)(lVar7 + 0x4c);
  (pEVar8->info).lvl16_inter_num = *(RK_U32 *)(lVar7 + 0x50);
  (pEVar8->info).lvl8_inter_num = *(RK_U32 *)(lVar7 + 0x54);
  (pEVar8->info).lvl32_intra_num = *(RK_U32 *)(lVar7 + 0x58);
  (pEVar8->info).lvl16_intra_num = *(RK_U32 *)(lVar7 + 0x5c);
  (pEVar8->info).lvl8_intra_num = *(RK_U32 *)(lVar7 + 0x60);
  (pEVar8->info).lvl4_intra_num = *(RK_U32 *)(lVar7 + 100);
  iVar23 = *(int *)(lVar7 + 0x34);
  task->hw_length = iVar23;
  task->length = task->length + iVar23;
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3a8),*(RK_S32 *)(lVar7 + 0x10));
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3a8),*(RK_S32 *)(lVar7 + 0x14));
  if (*(long **)((long)hal + 0x428) != (long *)0x0) {
    lVar17 = **(long **)((long)hal + 0x428);
    lVar11 = *(long *)(lVar17 + 0x80 + (long)(task->flags).reg_idx * 8);
    lVar12 = *(long *)(lVar11 + 0x20);
    iVar25 = (*(int *)(*(long *)(lVar17 + 0x390) + 0x10) + 0xfU & 0xffffff0) *
             (*(int *)(*(long *)(lVar17 + 0x390) + 0xc) + 0xfU & 0xfffffff0);
    uVar15 = *(uint *)(lVar12 + 0xc4);
    uVar24 = *(uint *)(lVar12 + 0xcc);
    uVar20 = *(uint *)(lVar12 + 0xd4);
    uVar1 = *(uint *)(lVar12 + 0xdc);
    iVar29 = (uVar1 >> 0x10) + (uVar20 >> 0x10) + (uVar24 >> 0x10) + (uVar15 >> 0x10);
    iVar30 = (*(uint *)(lVar12 + 0xe0) & 0xffff) + (*(uint *)(lVar12 + 0xd8) & 0xffff) +
             (*(uint *)(lVar12 + 0xd0) & 0xffff) + (*(uint *)(lVar12 + 200) & 0xffff);
    iVar23 = (*(uint *)(lVar12 + 0xe0) >> 0x10) + (*(uint *)(lVar12 + 0xd8) >> 0x10) +
             (*(uint *)(lVar12 + 0xd0) >> 0x10) + (*(uint *)(lVar12 + 200) >> 0x10);
    uVar2 = *(uint *)(lVar12 + 0xe4);
    uVar3 = *(uint *)(lVar12 + 0xec);
    uVar4 = *(uint *)(lVar12 + 0xf4);
    uVar5 = *(uint *)(lVar12 + 0xfc);
    iVar18 = (uVar5 >> 0x10) + (uVar4 >> 0x10) + (uVar3 >> 0x10) + (uVar2 >> 0x10);
    iVar27 = (*(uint *)(lVar12 + 0x100) & 0xffff) + (*(uint *)(lVar12 + 0xf8) & 0xffff) +
             (*(uint *)(lVar12 + 0xf0) & 0xffff) + (*(uint *)(lVar12 + 0xe8) & 0xffff);
    iVar28 = (*(uint *)(lVar12 + 0x100) >> 0x10) + (*(uint *)(lVar12 + 0xf8) >> 0x10) +
             (*(uint *)(lVar12 + 0xf0) >> 0x10) + (*(uint *)(lVar12 + 0xe8) >> 0x10);
    uVar22 = iVar25 >> 8;
    uVar14 = (((uint)(iVar30 * 5 + iVar23 * 6) >> 2) + iVar29) * 100;
    RVar21 = 2;
    if (uVar14 <= (iVar25 >> 3) + uVar22 * -2) {
      RVar21 = (RK_U32)(uVar22 * 0xd < uVar14);
    }
    pEVar8 = task->rc_task;
    lVar13 = *(long *)(lVar11 + 0x18);
    (pEVar8->info).complex_level = RVar21;
    if (*(int *)(lVar17 + 0x3f4) == 0) {
      uVar14 = iVar18 * 0x11 + iVar27 * 0x16 + iVar28 * 0x18;
    }
    else {
      uVar14 = iVar27 * 0xb + iVar18 * 8 + iVar28 * 0xc;
    }
    uVar14 = (uVar14 >> 2) * 100;
    RVar21 = 200;
    if ((uVar14 <= uVar22 * 0xf) && (RVar21 = 100, uVar14 <= uVar22 * 5)) {
      RVar21 = (RK_U32)(uVar22 >> 2 < uVar14);
    }
    iVar25 = (uVar24 & 0xffff) + (uVar15 & 0xffff) + (uVar20 & 0xffff) + (uVar1 & 0xffff);
    (pEVar8->info).motion_level = RVar21;
    if ((hal_h265e_debug._2_1_ & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","complex_level %d motion_level %d\n",(char *)0x0);
    }
    iVar26 = (uVar3 & 0xffff) + (uVar2 & 0xffff) + (uVar4 & 0xffff) + (uVar5 & 0xffff);
    uVar15 = *(uint *)(lVar13 + 0x24c);
    uVar20 = uVar15 >> 8 & 0xff;
    uVar24 = uVar15 >> 0x10 & 0xff;
    uVar15 = uVar24 * iVar23 + (uVar15 & 0xff) * iVar25 + ((uVar20 + (uVar15 & 0xff)) * iVar29 >> 1)
             + ((uVar20 + uVar24) * iVar30 >> 1);
    uVar24 = iVar25 + iVar29 + iVar30 + iVar23;
    if (uVar24 != 0) {
      uVar15 = uVar15 / uVar24;
    }
    *(uint *)(lVar11 + 0x13c) = uVar15;
    uVar20 = *(uint *)(lVar13 + 0x250) & 0xfff;
    uVar24 = *(uint *)(lVar13 + 0x250) >> 0x10 & 0xfff;
    uVar15 = *(uint *)(lVar13 + 0x254) & 0xfff;
    uVar15 = uVar15 * iVar28 + uVar20 * iVar26 + ((uVar24 + uVar20) * iVar18 >> 1) +
             ((uVar24 + uVar15) * iVar27 >> 1);
    uVar24 = iVar26 + iVar18 + iVar27 + iVar28;
    if (uVar24 != 0) {
      uVar15 = uVar15 / uVar24;
    }
    *(uint *)(lVar11 + 0x138) = uVar15;
    *(int *)(lVar11 + 0x140) = *(int *)(lVar11 + 0x140) + (*(uint *)(lVar12 + 0xa4) & 0x7fffff);
    *(uint *)(lVar11 + 0x2c) = *(uint *)&task->rc_task->frm >> 3 & 2;
    uVar15 = *(int *)(lVar11 + 0x34) * 8 + (pEVar8->info).bit_real;
    (pEVar8->info).bit_real = uVar15;
    if ((hal_h265e_debug._2_1_ & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","bit_real %d quality_real %d\n",(char *)0x0,(ulong)uVar15,
                 (ulong)(uint)(pEVar8->info).quality_real);
    }
    iVar23 = (pEVar8->info).bit_target;
    iVar18 = (pEVar8->info).bit_real;
    *(undefined2 *)(lVar11 + 0x170) = *(undefined2 *)(lVar17 + 0x360);
    uVar6 = *(undefined4 *)(lVar17 + 0x35c);
    *(undefined4 *)(lVar11 + 0x16c) = uVar6;
    *(undefined4 *)(lVar11 + 0x16d) = uVar6;
    if (iVar18 < iVar23) {
      iVar25 = iVar18 * 6 + 3;
      if (-1 < iVar18 * 6) {
        iVar25 = iVar18 * 6;
      }
      bVar19 = 3;
      if (iVar23 <= iVar25 >> 2) {
        iVar25 = iVar18 * 5 + 3;
        if (-1 < iVar18 * 5) {
          iVar25 = iVar18 * 5;
        }
        bVar19 = 2;
        if (iVar23 <= iVar25 >> 2) {
          iVar25 = iVar18 * 9 + 7;
          if (-1 < iVar18 * 9) {
            iVar25 = iVar18 * 9;
          }
          bVar19 = iVar25 >> 3 < iVar23;
        }
      }
    }
    else {
      bVar19 = 0xfb;
      if (iVar18 == iVar23 * 2 || SBORROW4(iVar18,iVar23 * 2) != iVar18 + iVar23 * -2 < 0) {
        iVar25 = iVar23 * 7;
        iVar27 = iVar25 + 3;
        if (-1 < iVar25) {
          iVar27 = iVar25;
        }
        bVar19 = 0xfc;
        if (iVar18 <= iVar27 >> 2) {
          iVar25 = iVar23 * 6 + 3;
          if (-1 < iVar23 * 6) {
            iVar25 = iVar23 * 6;
          }
          bVar19 = 0xfd;
          if (iVar18 <= iVar25 >> 2) {
            iVar25 = iVar23 * 5 + 3;
            if (-1 < iVar23 * 5) {
              iVar25 = iVar23 * 5;
            }
            bVar19 = ~(iVar25 >> 2 < iVar18);
          }
        }
      }
    }
    *(byte *)(lVar11 + 0x16c) = bVar19;
    iVar23 = 0;
    lVar17 = -5;
    do {
      iVar23 = iVar23 + *(char *)(lVar11 + 0x171 + lVar17);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0);
    if (((ulong)task->rc_task->frm & 0x10) != 0) {
      *(undefined1 *)(lVar11 + 0x171) = 0;
    }
    if (iVar23 < -9) {
      *(undefined1 *)(lVar11 + 0x171) = 2;
    }
    else if ((iVar23 < -2) && (*(char *)(lVar11 + 0x171) < '\x02')) {
      *(undefined1 *)(lVar11 + 0x171) = 1;
    }
    uVar15 = 0;
    uVar24 = 0;
    if (*(uint *)(lVar11 + 0x140) != 0) {
      uVar24 = *(uint *)(lVar11 + 0x13c) / *(uint *)(lVar11 + 0x140);
    }
    *(uint *)(lVar11 + 0x13c) = uVar24;
    if (*(uint *)(lVar11 + 0x144) != 0) {
      uVar15 = *(uint *)(lVar11 + 0x138) / *(uint *)(lVar11 + 0x144);
    }
    *(uint *)(lVar11 + 0x138) = uVar15;
    (pEVar8->info).madi = uVar24;
    (pEVar8->info).madp = uVar15;
  }
  if (((byte)hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","output stream size %d\n",(char *)0x0,
               (ulong)*(uint *)(lVar7 + 0x34));
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0xa1f);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v510_ret_task(void *hal, HalEncTask *task)
{
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu510H265eFrmCfg *frm = ctx->frms[task_idx];
    Vepu510H265Fbk *fb = &frm->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu510_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    h265e_dpb_hal_end(ctx->dpb, frm->hal_curr_idx);
    h265e_dpb_hal_end(ctx->dpb, frm->hal_refr_idx);

    vepu510_h265e_tune_stat_update(ctx->tune, enc_task);

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);
    hal_h265e_leave();
    return MPP_OK;
}